

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

CAmount AmountFromValue(UniValue *value,int decimals)

{
  bool bVar1;
  UniValue *pUVar2;
  long in_FS_OFFSET;
  string_view val;
  CAmount amount;
  ulong local_50;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (value->typ - VSTR < 2) {
    val._M_str = (value->val)._M_dataplus._M_p;
    val._M_len = (value->val)._M_string_length;
    bVar1 = ParseFixedPoint(val,decimals,(int64_t *)&local_50);
    if (bVar1) {
      if (local_50 < 0x775f05a074001) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          return local_50;
        }
      }
      else {
        pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"Amount out of range","");
        JSONRPCError(pUVar2,-3,&local_48);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
    }
    else {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Invalid amount","");
      JSONRPCError(pUVar2,-3,&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  else {
    pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Amount is not a number or string","");
    JSONRPCError(pUVar2,-3,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

CAmount AmountFromValue(const UniValue& value, int decimals)
{
    if (!value.isNum() && !value.isStr())
        throw JSONRPCError(RPC_TYPE_ERROR, "Amount is not a number or string");
    CAmount amount;
    if (!ParseFixedPoint(value.getValStr(), decimals, &amount))
        throw JSONRPCError(RPC_TYPE_ERROR, "Invalid amount");
    if (!MoneyRange(amount))
        throw JSONRPCError(RPC_TYPE_ERROR, "Amount out of range");
    return amount;
}